

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O0

int Abc_NodeGetLevel(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_20;
  int local_1c;
  int Level;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = Abc_ObjFanin(pObj,local_1c);
    local_20 = Abc_MaxInt(local_20,*(uint *)&pAVar2->field_0x14 >> 0xc);
  }
  return local_20 + 1;
}

Assistant:

int Abc_NodeGetLevel( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i, Level;
    Level = 0;
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Level = Abc_MaxInt( Level, (int)pFanin->Level );
    return Level + 1;
}